

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.cpp
# Opt level: O2

void __thiscall BigInt::operator=(BigInt *this,BigInt *b)

{
  int iVar1;
  string value;
  string local_58;
  string local_38 [32];
  
  iVar1 = b->sign;
  to_string_abi_cxx11_(&value,b);
  if (iVar1 != 0) {
    std::__cxx11::string::substr((ulong)local_38,(ulong)&value);
    std::__cxx11::string::operator=((string *)&value,local_38);
    std::__cxx11::string::~string(local_38);
  }
  std::__cxx11::string::string((string *)&local_58,(string *)&value);
  set_number(this,&local_58,iVar1 == 0);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&value);
  return;
}

Assistant:

void BigInt::operator=(BigInt b) {
    bool positive = b.sign == 0 ? true : false;
    string value = b.to_string();
    if (positive == false) {
        value = value.substr(1);
    }
    this->set_number(value, positive);
}